

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O1

SC_Timing * Scl_CellPinTime(SC_Cell *pCell,int iPin)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  SC_Timing *pSVar6;
  
  if (-1 < iPin) {
    uVar1 = pCell->n_inputs;
    if (iPin < (int)uVar1) {
      if ((-1 < (int)uVar1) && ((int)uVar1 < (pCell->vPins).nSize)) {
        pvVar4 = (pCell->vPins).pArray[uVar1];
        uVar2 = *(uint *)((long)pvVar4 + 0x44);
        if (uVar2 != uVar1) {
          __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                        ,0x292,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
        }
        if (iPin < (int)uVar2) {
          lVar5 = *(long *)(*(long *)((long)pvVar4 + 0x48) + (ulong)(uint)iPin * 8);
          iVar3 = *(int *)(lVar5 + 0xc);
          if (iVar3 == 0) {
            pSVar6 = (SC_Timing *)0x0;
          }
          else {
            if (iVar3 != 1) {
              __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                            ,0x296,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
            }
            pSVar6 = (SC_Timing *)**(undefined8 **)(lVar5 + 0x10);
          }
          return pSVar6;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
}

Assistant:

static inline SC_Timing * Scl_CellPinTime( SC_Cell * pCell, int iPin )
{
    SC_Pin * pPin;
    SC_Timings * pRTime;
    assert( iPin >= 0 && iPin < pCell->n_inputs );
    pPin = SC_CellPin( pCell, pCell->n_inputs );
    assert( Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs );
    pRTime = (SC_Timings *)Vec_PtrEntry( &pPin->vRTimings, iPin );
    if ( Vec_PtrSize(&pRTime->vTimings) == 0 )
        return NULL;
    assert( Vec_PtrSize(&pRTime->vTimings) == 1 );
    return (SC_Timing *)Vec_PtrEntry( &pRTime->vTimings, 0 );
}